

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O1

string_view __thiscall bloaty::dwarf::ReadDebugStrEntry(dwarf *this,string_view section,size_t ofs)

{
  dwarf *pdVar1;
  string_view sVar2;
  string_view local_10;
  
  pdVar1 = (dwarf *)section._M_str;
  local_10._M_str = (char *)section._M_len;
  local_10._M_len = (long)this - (long)pdVar1;
  if (pdVar1 <= this) {
    local_10._M_str = local_10._M_str + (long)pdVar1;
    sVar2 = ReadUntilConsuming(&local_10,'\0');
    return sVar2;
  }
  local_10._M_len = (size_t)this;
  Throw("premature EOF reading variable-length DWARF data",0xad);
}

Assistant:

std::string_view ReadDebugStrEntry(std::string_view section, size_t ofs) {
  SkipBytes(ofs, &section);
  return ReadNullTerminated(&section);
}